

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint64_t farmhash64_uo_with_seeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint128_c_t uVar23;
  uint128_c_t uVar24;
  ulong local_60;
  
  if (0x40 < len) {
    uVar13 = 0;
    lVar12 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar16 = (ulong)(lVar12 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar12 * -0x651e95c4d06fbfb1;
    lVar18 = seed0 + uVar16 * 0x651e95c4d06fbfb1;
    lVar17 = seed0 * -0x651e95c4d06fbfb1;
    lVar5 = (ulong)((uint)lVar18 & 0x82) + 0x9ae16a3b2f90404f;
    uVar21 = (ulong)((uint)(len - 1) & 0x3f);
    plVar6 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    lVar7 = 0;
    local_60 = uVar16 * -0x651e95c4d06fbfb1;
    do {
      plVar1 = (long *)((long)s + 0x18);
      lVar3 = *(long *)((long)s + 0x30);
      lVar20 = *(long *)((long)s + 8);
      lVar10 = uVar13 + *(long *)((long)s + 0x38);
      uVar13 = lVar12 + *(long *)((long)s + 0x10);
      uVar16 = lVar17 + *(long *)s + lVar20;
      lVar12 = lVar18 + *(long *)((long)s + 0x38);
      uVar14 = uVar13 >> 0x1d | uVar13 << 0x23;
      uVar13 = (uVar16 >> 0x1a | uVar16 << 0x26) * 9;
      lVar17 = uVar13 + lVar20;
      uVar16 = (local_60 + *plVar1) * lVar5;
      lVar11 = (uVar16 >> 0x20 | uVar16 << 0x20) + lVar10;
      lVar18 = *(long *)s + lVar3 + lVar11 * 9;
      uVar16 = seed0 + *(long *)((long)s + 0x20);
      lVar7 = (lVar7 + lVar3 ^ uVar13) * 9 + *(long *)((long)s + 0x20);
      lVar8 = (uVar16 >> 0x21 | uVar16 * 0x80000000) + *(long *)((long)s + 0x10);
      plVar2 = (long *)((long)s + 0x28);
      s = (char *)((long)s + 0x40);
      lVar12 = lVar12 + lVar8;
      uVar13 = seed1 + lVar20 + *plVar2;
      lVar20 = lVar17 - lVar12;
      uVar16 = lVar3 + *plVar2 + lVar10 + lVar11 + lVar20;
      seed1 = (uVar13 >> 0x1e | uVar13 << 0x22) + *plVar1 + lVar7;
      seed0 = lVar8 + lVar20;
      lVar7 = lVar7 + seed1;
      lVar17 = lVar17 + uVar16;
      uVar13 = uVar16 >> 0x22 | uVar16 * 0x40000000;
      local_60 = uVar14;
    } while ((long *)s != plVar6);
    uVar19 = seed0 >> 0x14 | seed0 << 0x2c;
    uVar16 = seed1 >> 0x1c | seed1 << 0x24;
    lVar18 = lVar18 * 9 + lVar12;
    uVar15 = lVar12 + lVar18;
    uVar9 = (uVar19 - lVar17) + uVar15 + *(long *)((long)plVar6 + (uVar21 - 0x37));
    uVar14 = uVar14 + lVar7 + uVar21;
    uVar22 = uVar14 >> 0x21 | uVar14 * 0x80000000;
    uVar15 = *(ulong *)((long)plVar6 + (uVar21 - 0xf)) ^ uVar16 ^ uVar15;
    uVar14 = uVar13 * 9 ^ (uVar9 >> 0x25 | uVar9 * 0x8000000) * lVar5;
    uVar9 = uVar19 + *(long *)((long)plVar6 + (uVar21 - 0x17)) +
            (uVar15 >> 0x2a | uVar15 << 0x16) * lVar5;
    lVar12 = uVar22 * lVar5;
    uVar23 = weak_farmhash_na_len_32_with_seeds
                       ((char *)((long)plVar6 + (uVar21 - 0x3f)),uVar16 * lVar5,
                        lVar7 + uVar21 + uVar14);
    uVar24 = weak_farmhash_na_len_32_with_seeds
                       ((char *)((long)plVar6 + (uVar21 - 0x1f)),uVar13 + lVar12,
                        *(long *)((long)plVar6 + (uVar21 - 0x2f)) + uVar9);
    uVar16 = lVar12 + uVar24.b;
    uVar13 = uVar24.a ^ uVar9;
    uVar21 = (uVar23.a + uVar14 ^ uVar13) * lVar5;
    uVar9 = (uVar23.b + uVar9 ^ uVar16) * -0x651e95c4d06fbfb1;
    uVar16 = uVar9 >> 0x2f ^ uVar16 ^ uVar9;
    uVar13 = (uVar13 ^ uVar21 ^ uVar21 >> 0x2f) * lVar5;
    uVar14 = (uVar16 * -0x41befec400000000 | uVar16 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar14;
    uVar13 = (((uVar13 ^ uVar13 >> 0x2f) + uVar22) * lVar5 - lVar18 ^ uVar14) * -0x651e95c4d06fbfb1;
    uVar13 = uVar13 >> 0x2f ^ uVar14 ^ uVar13;
    return (uVar13 * 0x5f20809e00000000 | uVar13 * -0x651e95c4d06fbfb1 >> 0x1f) *
           -0x651e95c4d06fbfb1;
  }
  uVar4 = farmhash64_na(s,len);
  uVar4 = farmhash_len_16(uVar4 - seed0,seed1);
  return uVar4;
}

Assistant:

uint64_t farmhash64_uo_with_seeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhash64_na_with_seeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = smix(y * k2) * k2;
  uint128_c_t v = make_uint128_c_t(seed0, seed1);
  uint128_c_t w = make_uint128_c_t(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = fetch64(s);
    uint64_t a1 = fetch64(s + 8);
    uint64_t a2 = fetch64(s + 16);
    uint64_t a3 = fetch64(s + 24);
    uint64_t a4 = fetch64(s + 32);
    uint64_t a5 = fetch64(s + 40);
    uint64_t a6 = fetch64(s + 48);
    uint64_t a7 = fetch64(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.a += a4;
    v.b += a5 + a1;
    w.a += a6;
    w.b += a7;

    x = ror64(x, 26);
    x *= 9;
    y = ror64(y, 29);
    z *= mul;
    v.a = ror64(v.a, 33);
    v.b = ror64(v.b, 30);
    w.a ^= x;
    w.a *= 9;
    z = ror64(z, 32);
    z += w.b;
    w.b += z;
    z *= 9;
    swap64(&u, &y);

    z += a0 + a6;
    v.a += a2;
    v.b += a3;
    w.a += a4;
    w.b += a5 + a6;
    x += a1;
    y += a7;

    y += v.a;
    v.a += x - y;
    v.b += w.a;
    w.a += v.b;
    w.b += x - y;
    x += w.b;
    w.b = ror64(w.b, 34);
    swap64(&u, &z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.b = ror64(v.b, 28);
  v.a = ror64(v.a, 20);
  w.a += ((len - 1) & 63);
  u += y;
  y += u;
  x = ror64(y - x + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y ^ v.b ^ fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  return farmhash_uo_h(farmhash_len_16_mul(v.a + x, w.a ^ y, mul) + z - u,
           farmhash_uo_h(v.b + y, w.b + z, k2, 30) ^ x,
           k2,
           31);
}